

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O1

void pztopology::TPZPrism::GetSideHDivDirections
               (TPZVec<int> *sides,TPZVec<int> *dir,TPZVec<int> *bilounao)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  
  (*sides->_vptr_TPZVec[3])(sides,0x3f);
  (*dir->_vptr_TPZVec[3])(dir,0x3f);
  (*bilounao->_vptr_TPZVec[3])(bilounao);
  piVar1 = sides->fStore;
  piVar2 = dir->fStore;
  piVar3 = bilounao->fStore;
  lVar4 = 0;
  do {
    *(undefined4 *)((long)piVar1 + lVar4) = *(undefined4 *)((long)&vectorsideorderPr + lVar4);
    *(undefined4 *)((long)piVar2 + lVar4) = *(undefined4 *)((long)&direcaoksioueta + lVar4);
    *(undefined4 *)((long)piVar3 + lVar4) = *(undefined4 *)((long)&bilinearounao + lVar4);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xfc);
  return;
}

Assistant:

void TPZPrism::GetSideHDivDirections(TPZVec<int> &sides, TPZVec<int> &dir, TPZVec<int> &bilounao)
    {
        int nsides = NumSides()*3;
        
        sides.Resize(nsides);
        dir.Resize(nsides);
        bilounao.Resize(nsides);
        
        for (int is = 0; is<nsides; is++)
        {
            sides[is] = vectorsideorderPr[is];
            dir[is] = direcaoksioueta[is];
            bilounao[is] = bilinearounao[is];
        }
    }